

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecx_kmgmt.c
# Opt level: O0

int ecx_key_pairwise_check(ECX_KEY *ecx,int type)

{
  int iVar1;
  uint8_t *private_key;
  uint in_ESI;
  long in_RDI;
  uint8_t pub [64];
  char *in_stack_00000080;
  uint8_t *in_stack_00000088;
  uint8_t *in_stack_00000090;
  OSSL_LIB_CTX *in_stack_00000098;
  uint8_t *in_stack_000000e8;
  uint8_t *in_stack_000000f0;
  uint8_t *in_stack_ffffffffffffff98;
  uint8_t *in_stack_ffffffffffffffa8;
  OSSL_LIB_CTX *in_stack_ffffffffffffffb0;
  
  private_key = (uint8_t *)(ulong)in_ESI;
  switch(private_key) {
  case (uint8_t *)0x0:
    ossl_x25519_public_from_private(in_stack_000000f0,in_stack_000000e8);
    break;
  case (uint8_t *)0x1:
    ossl_x448_public_from_private(private_key,in_stack_ffffffffffffff98);
    break;
  case (uint8_t *)0x2:
    iVar1 = ossl_ed25519_public_from_private
                      (in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080);
    if (iVar1 == 0) {
      return 0;
    }
    break;
  case (uint8_t *)0x3:
    iVar1 = ossl_ed448_public_from_private
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,private_key,
                       (char *)in_stack_ffffffffffffff98);
    if (iVar1 == 0) {
      return 0;
    }
    break;
  default:
    return 0;
  }
  iVar1 = CRYPTO_memcmp((void *)(in_RDI + 0x11),&stack0xffffffffffffffa8,*(size_t *)(in_RDI + 0x58))
  ;
  return (uint)(iVar1 == 0);
}

Assistant:

static int ecx_key_pairwise_check(const ECX_KEY *ecx, int type)
{
    uint8_t pub[64];

    switch (type) {
    case ECX_KEY_TYPE_X25519:
        ossl_x25519_public_from_private(pub, ecx->privkey);
        break;
    case ECX_KEY_TYPE_X448:
        ossl_x448_public_from_private(pub, ecx->privkey);
        break;
    case ECX_KEY_TYPE_ED25519:
        if (!ossl_ed25519_public_from_private(ecx->libctx, pub, ecx->privkey,
                                              ecx->propq))
            return 0;
        break;
    case ECX_KEY_TYPE_ED448:
        if (!ossl_ed448_public_from_private(ecx->libctx, pub, ecx->privkey,
                                            ecx->propq))
            return 0;
        break;
    default:
        return 0;
    }
    return CRYPTO_memcmp(ecx->pubkey, pub, ecx->keylen) == 0;
}